

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkFromDarChoices(Abc_Ntk_t *pNtkOld,Aig_Man_t *pMan)

{
  Abc_Aig_t *pMan_00;
  int iVar1;
  Abc_Ntk_t *pNtk;
  Abc_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  Aig_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  int local_34;
  int i;
  Aig_Obj_t *pTemp;
  Aig_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  Aig_Man_t *pMan_local;
  Abc_Ntk_t *pNtkOld_local;
  
  if (pMan->pEquivs == (Aig_Obj_t **)0x0) {
    __assert_fail("pMan->pEquivs != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x460,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  iVar1 = Aig_ManBufNum(pMan);
  if (iVar1 != 0) {
    __assert_fail("Aig_ManBufNum(pMan) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                  ,0x461,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
  }
  pNtk = Abc_NtkStartFrom(pNtkOld,ABC_NTK_STRASH,ABC_FUNC_AIG);
  pNtk->nConstrs = pMan->nConstrs;
  pNtk->nBarBufs = pNtkOld->nBarBufs;
  Aig_ManCleanData(pMan);
  pAVar2 = Abc_AigConst1(pNtk);
  pAVar3 = Aig_ManConst1(pMan);
  (pAVar3->field_5).pData = pAVar2;
  for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pvVar4 = Vec_PtrEntry(pMan->vCis,local_34);
    pAVar2 = Abc_NtkCi(pNtk,local_34);
    *(Abc_Obj_t **)((long)pvVar4 + 0x28) = pAVar2;
  }
  local_34 = 0;
  do {
    iVar1 = Vec_PtrSize(pMan->vObjs);
    if (iVar1 <= local_34) {
      for (local_34 = 0; iVar1 = Vec_PtrSize(pMan->vCos), local_34 < iVar1; local_34 = local_34 + 1)
      {
        pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vCos,local_34);
        pAVar2 = Abc_NtkCo(pNtk,local_34);
        pAVar6 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
        Abc_ObjAddFanin(pAVar2,pAVar6);
      }
      iVar1 = Abc_NtkCheck(pNtk);
      if (iVar1 == 0) {
        Abc_Print(1,"Abc_NtkFromDar(): Network check has failed.\n");
      }
      return pNtk;
    }
    pAVar3 = (Aig_Obj_t *)Vec_PtrEntry(pMan->vObjs,local_34);
    if ((pAVar3 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar3), iVar1 != 0)) {
      pMan_00 = (Abc_Aig_t *)pNtk->pManFunc;
      pAVar2 = (Abc_Obj_t *)Aig_ObjChild0Copy(pAVar3);
      pAVar6 = (Abc_Obj_t *)Aig_ObjChild1Copy(pAVar3);
      pAVar2 = Abc_AigAnd(pMan_00,pAVar2,pAVar6);
      (pAVar3->field_5).pData = pAVar2;
      pAVar5 = Aig_ObjEquiv(pMan,pAVar3);
      if (pAVar5 != (Aig_Obj_t *)0x0) {
        if ((pAVar5->field_5).pData == (void *)0x0) {
          __assert_fail("pTemp->pData != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcDar.c"
                        ,0x471,"Abc_Ntk_t *Abc_NtkFromDarChoices(Abc_Ntk_t *, Aig_Man_t *)");
        }
        *(anon_union_8_3_a781e0d5_for_Aig_Obj_t__13 *)((long)(pAVar3->field_5).pData + 0x38) =
             pAVar5->field_5;
      }
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

Abc_Ntk_t * Abc_NtkFromDarChoices( Abc_Ntk_t * pNtkOld, Aig_Man_t * pMan )
{
    Abc_Ntk_t * pNtkNew;
    Aig_Obj_t * pObj, * pTemp;
    int i;
    assert( pMan->pEquivs != NULL );
    assert( Aig_ManBufNum(pMan) == 0 );
    // perform strashing
    pNtkNew = Abc_NtkStartFrom( pNtkOld, ABC_NTK_STRASH, ABC_FUNC_AIG );
    pNtkNew->nConstrs = pMan->nConstrs;
    pNtkNew->nBarBufs = pNtkOld->nBarBufs;
    // transfer the pointers to the basic nodes
    Aig_ManCleanData( pMan );
    Aig_ManConst1(pMan)->pData = Abc_AigConst1(pNtkNew);
    Aig_ManForEachCi( pMan, pObj, i )
        pObj->pData = Abc_NtkCi(pNtkNew, i);
    // rebuild the AIG
    Aig_ManForEachNode( pMan, pObj, i )
    {
        pObj->pData = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, (Abc_Obj_t *)Aig_ObjChild0Copy(pObj), (Abc_Obj_t *)Aig_ObjChild1Copy(pObj) );
        if ( (pTemp = Aig_ObjEquiv(pMan, pObj)) )
        {
            assert( pTemp->pData != NULL );
            ((Abc_Obj_t *)pObj->pData)->pData = ((Abc_Obj_t *)pTemp->pData);
        }
    }
    // connect the PO nodes
    Aig_ManForEachCo( pMan, pObj, i )
        Abc_ObjAddFanin( Abc_NtkCo(pNtkNew, i), (Abc_Obj_t *)Aig_ObjChild0Copy(pObj) );
    if ( !Abc_NtkCheck( pNtkNew ) )
        Abc_Print( 1, "Abc_NtkFromDar(): Network check has failed.\n" );

    // verify topological order
    if ( 0 )
    {
        Abc_Obj_t * pNode;
        Abc_NtkForEachNode( pNtkNew, pNode, i )
            if ( Abc_AigNodeIsChoice( pNode ) )
            {
                int Counter = 0;
                for ( pNode = Abc_ObjEquiv(pNode); pNode; pNode = Abc_ObjEquiv(pNode) )
                    Counter++;
                printf( "%d ", Counter );
            }
        printf( "\n" );
    }
    return pNtkNew;
}